

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGUIElement.h
# Opt level: O2

void __thiscall irr::gui::IGUIElement::move(IGUIElement *this,vector2d<int> absoluteMovement)

{
  vector2d<int> local_20;
  rect<int> local_18;
  
  local_20 = absoluteMovement;
  local_18 = core::rect<int>::operator+(&this->DesiredRect,&local_20);
  setRelativePosition(this,&local_18);
  return;
}

Assistant:

virtual void move(core::position2d<s32> absoluteMovement)
	{
		setRelativePosition(DesiredRect + absoluteMovement);
	}